

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::fillStackRowBounds(HPresolve *this,int row)

{
  stack<double,_std::deque<double,_std::allocator<double>_>_> *this_00;
  double *pdVar1;
  pointer pdVar2;
  double *pdVar3;
  ulong uVar4;
  
  uVar4 = (ulong)row;
  pdVar2 = (this->super_HPreData).rowUpper.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (uVar4 < (ulong)((long)(this->super_HPreData).rowUpper.
                            super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish - (long)pdVar2 >> 3)) {
    this_00 = &(this->super_HPreData).postValue;
    pdVar1 = pdVar2 + uVar4;
    pdVar3 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    if (pdVar3 == *(_Elt_pointer *)
                   ((long)&(this->super_HPreData).postValue.c.
                           super__Deque_base<double,_std::allocator<double>_>._M_impl.
                           super__Deque_impl_data._M_finish + 0x10) + -1) {
      std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                ((deque<double,std::allocator<double>> *)this_00,pdVar1);
    }
    else {
      *pdVar3 = *pdVar1;
      (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>._M_impl.
      super__Deque_impl_data._M_finish._M_cur = pdVar3 + 1;
    }
    pdVar2 = (this->super_HPreData).rowLower.super__Vector_base<double,_std::allocator<double>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar4 < (ulong)((long)(this->super_HPreData).rowLower.
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)pdVar2 >> 3)) {
      pdVar1 = pdVar2 + uVar4;
      pdVar3 = (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (pdVar3 != *(_Elt_pointer *)
                     ((long)&(this->super_HPreData).postValue.c.
                             super__Deque_base<double,_std::allocator<double>_>._M_impl.
                             super__Deque_impl_data._M_finish + 0x10) + -1) {
        *pdVar3 = *pdVar1;
        (this->super_HPreData).postValue.c.super__Deque_base<double,_std::allocator<double>_>.
        _M_impl.super__Deque_impl_data._M_finish._M_cur = pdVar3 + 1;
        return;
      }
      std::deque<double,std::allocator<double>>::_M_push_back_aux<double_const&>
                ((deque<double,std::allocator<double>> *)this_00,pdVar1);
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",uVar4);
}

Assistant:

void HPresolve::fillStackRowBounds(int row) {
	postValue.push(rowUpper.at(row));
	postValue.push(rowLower.at(row));
}